

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCreate.c
# Opt level: O0

Map_Node_t * Map_NodeAnd(Map_Man_t *pMan,Map_Node_t *p1,Map_Node_t *p2)

{
  int iVar1;
  uint local_34;
  Map_Node_t *pMStack_30;
  uint Key;
  Map_Node_t *pEnt;
  Map_Node_t *p2_local;
  Map_Node_t *p1_local;
  Map_Man_t *pMan_local;
  
  pMan_local = (Map_Man_t *)p1;
  if (p1 != p2) {
    if (p1 == (Map_Node_t *)((ulong)p2 ^ 1)) {
      pMan_local = (Map_Man_t *)((ulong)pMan->pConst1 ^ 1);
    }
    else {
      iVar1 = Map_NodeIsConst(p1);
      if (iVar1 == 0) {
        iVar1 = Map_NodeIsConst(p2);
        if (iVar1 == 0) {
          pEnt = p2;
          p2_local = p1;
          if (*(int *)(((ulong)p2 & 0xfffffffffffffffe) + 0x10) <
              *(int *)(((ulong)p1 & 0xfffffffffffffffe) + 0x10)) {
            pEnt = p1;
            p2_local = p2;
          }
          local_34 = Map_HashKey2(p2_local,pEnt,pMan->nBins);
          for (pMStack_30 = pMan->pBins[local_34]; pMStack_30 != (Map_Node_t *)0x0;
              pMStack_30 = pMStack_30->pNext) {
            if ((pMStack_30->p1 == p2_local) && (pMStack_30->p2 == pEnt)) {
              return pMStack_30;
            }
          }
          if (SBORROW4(pMan->nNodes,pMan->nBins * 2) == pMan->nNodes + pMan->nBins * -2 < 0) {
            Map_TableResize(pMan);
            local_34 = Map_HashKey2(p2_local,pEnt,pMan->nBins);
          }
          pMan_local = (Map_Man_t *)Map_NodeCreate(pMan,p2_local,pEnt);
          *(Map_Node_t **)&pMan_local->nBins = pMan->pBins[local_34];
          pMan->pBins[local_34] = (Map_Node_t *)pMan_local;
        }
        else if (p2 != pMan->pConst1) {
          pMan_local = (Map_Man_t *)((ulong)pMan->pConst1 ^ 1);
        }
      }
      else {
        pMan_local = (Map_Man_t *)p2;
        if (p1 != pMan->pConst1) {
          pMan_local = (Map_Man_t *)((ulong)pMan->pConst1 ^ 1);
        }
      }
    }
  }
  return (Map_Node_t *)pMan_local;
}

Assistant:

Map_Node_t * Map_NodeAnd( Map_Man_t * pMan, Map_Node_t * p1, Map_Node_t * p2 )
{
    Map_Node_t * pEnt;
    unsigned Key;

    if ( p1 == p2 )
        return p1;
    if ( p1 == Map_Not(p2) )
        return Map_Not(pMan->pConst1);
    if ( Map_NodeIsConst(p1) )
    {
        if ( p1 == pMan->pConst1 )
            return p2;
        return Map_Not(pMan->pConst1);
    }
    if ( Map_NodeIsConst(p2) )
    {
        if ( p2 == pMan->pConst1 )
            return p1;
        return Map_Not(pMan->pConst1);
    }

    if ( Map_Regular(p1)->Num > Map_Regular(p2)->Num )
        pEnt = p1, p1 = p2, p2 = pEnt;

    Key = Map_HashKey2( p1, p2, pMan->nBins );
    for ( pEnt = pMan->pBins[Key]; pEnt; pEnt = pEnt->pNext )
        if ( pEnt->p1 == p1 && pEnt->p2 == p2 )
            return pEnt;
    // resize the table
    if ( pMan->nNodes >= 2 * pMan->nBins )
    {
        Map_TableResize( pMan );
        Key = Map_HashKey2( p1, p2, pMan->nBins );
    }
    // create the new node
    pEnt = Map_NodeCreate( pMan, p1, p2 );
    // add the node to the corresponding linked list in the table
    pEnt->pNext = pMan->pBins[Key];
    pMan->pBins[Key] = pEnt;
    return pEnt;
}